

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O3

ListBuilder * __thiscall
capnp::_::PointerBuilder::getStructList
          (ListBuilder *__return_storage_ptr__,PointerBuilder *this,StructSize elementSize,
          word *defaultValue)

{
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  uint uVar4;
  BuilderArena *pBVar5;
  SegmentBuilder *pSVar6;
  undefined8 *puVar7;
  ulong uVar8;
  word *pwVar9;
  word *pwVar10;
  uint uVar11;
  WirePointer *pWVar12;
  WirePointer *src;
  WirePointer *pWVar13;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  int iVar17;
  int iVar18;
  ushort uVar19;
  uint uVar20;
  byte bVar21;
  CapTableBuilder *pCVar22;
  AllocateResult AVar23;
  AllocateResult AVar24;
  AllocateResult AVar25;
  Iterator __end5;
  Fault f;
  Iterator __end4;
  AllocateResult local_d0;
  WirePointer *local_c0;
  WirePointer *local_b8;
  CapTableBuilder *local_b0;
  WirePointer *local_a8;
  WirePointer *local_a0;
  Fault local_98;
  ulong local_90;
  ulong local_88;
  ListBuilder *local_80;
  ulong local_78;
  ulong local_70;
  SegmentBuilder *local_68;
  uint local_60;
  uint local_5c;
  ulong local_58;
  word *local_50;
  size_t local_48;
  ulong local_40;
  ulong local_38;
  
  local_d0.words = (word *)this->pointer;
  local_d0.segment = this->segment;
  pCVar22 = this->capTable;
  uVar20 = (((WirePointer *)local_d0.words)->offsetAndKind).value;
  local_b8 = (WirePointer *)CONCAT44(local_b8._4_4_,elementSize);
  uVar14 = (uint)elementSize >> 0x10;
  if ((((WirePointer *)local_d0.words)->field_1).upper32Bits == 0 && uVar20 == 0) goto LAB_001c1912;
  local_a0 = (WirePointer *)local_d0.words + (long)((int)uVar20 >> 2) + 1;
  while( true ) {
    pwVar10 = local_d0.words;
    pSVar6 = local_d0.segment;
    pWVar12 = (WirePointer *)local_d0.words;
    if ((uVar20 & 3) == 2) {
      pSVar6 = BuilderArena::getSegment
                         ((BuilderArena *)((local_d0.segment)->super_SegmentReader).arena,
                          (SegmentId)
                          ((anon_union_4_5_35ddcec3_for_WirePointer_1 *)((long)local_d0.words + 4))
                          ->structRef);
      uVar20 = ((WireValue<uint32_t> *)&pwVar10->content)->value;
      pwVar10 = (pSVar6->super_SegmentReader).ptr.ptr;
      uVar16 = (ulong)(uVar20 & 0xfffffff8);
      pWVar13 = (WirePointer *)((long)&pwVar10->content + uVar16);
      pWVar12 = (WirePointer *)((long)&pwVar10[1].content + uVar16);
      if ((uVar20 & 4) == 0) {
        local_a0 = pWVar12 + ((int)(pWVar13->offsetAndKind).value >> 2);
        pWVar12 = pWVar13;
      }
      else {
        pSVar6 = BuilderArena::getSegment
                           ((BuilderArena *)(pSVar6->super_SegmentReader).arena,
                            (SegmentId)(pWVar13->field_1).structRef);
        local_a0 = (WirePointer *)
                   ((long)&((pSVar6->super_SegmentReader).ptr.ptr)->content +
                   (ulong)((pWVar13->offsetAndKind).value & 0xfffffff8));
      }
    }
    local_b0 = pCVar22;
    local_68 = pSVar6;
    if (pSVar6->readOnly == true) {
      SegmentBuilder::throwNotWritable(pSVar6);
    }
    pwVar10 = local_d0.words;
    pSVar6 = local_d0.segment;
    if (((pWVar12->offsetAndKind).value & 3) == 1) {
      uVar20 = (pWVar12->field_1).upper32Bits;
      bVar21 = (byte)uVar20 & 7;
      uVar11 = (uint)local_b8;
      uVar19 = elementSize.pointers;
      if (bVar21 == 7) {
        uVar20 = (uint)*(uint64_t *)&(local_a0->offsetAndKind).value;
        if ((uVar20 & 3) == 0) {
          local_a8 = local_a0 + 1;
          uVar1 = *(ushort *)&local_a0->field_1;
          local_58 = (ulong)uVar1;
          uVar2 = *(ushort *)((long)&local_a0->field_1 + 2);
          local_70 = (ulong)uVar2;
          local_90 = (ulong)((uint)uVar2 + (uint)uVar1);
          uVar20 = uVar20 >> 2 & 0x1fffffff;
          uVar16 = (ulong)uVar20;
          if (uVar2 < uVar19 || uVar1 < (ushort)local_b8) {
            uVar20 = (uint)uVar1;
            if (uVar1 <= (ushort)local_b8) {
              uVar20 = uVar11;
            }
            local_5c = (uint)uVar2;
            if (uVar19 < uVar2) {
              uVar14 = local_5c;
            }
            local_60 = uVar20 & 0xffff;
            local_88 = (ulong)(uVar14 + local_60);
            uVar15 = local_88 * uVar16;
            if (0x1ffffffe < uVar15) {
              WireHelpers::getWritableStructListPointer::anon_class_1_0_00000001::operator()
                        ((anon_class_1_0_00000001 *)&local_98);
            }
            pwVar10 = local_d0.words;
            if (((((WireValue<uint32_t> *)&(local_d0.words)->content)->value & 3) == 2) &&
               (pSVar6 = BuilderArena::getSegment
                                   ((BuilderArena *)((local_d0.segment)->super_SegmentReader).arena,
                                    (SegmentId)
                                    ((anon_union_4_5_35ddcec3_for_WirePointer_1 *)
                                    ((long)local_d0.words + 4))->structRef),
               pSVar6->readOnly == false)) {
              uVar11 = ((WireValue<uint32_t> *)&pwVar10->content)->value;
              puVar7 = (undefined8 *)
                       ((long)&((pSVar6->super_SegmentReader).ptr.ptr)->content +
                       (ulong)(uVar11 & 0xfffffff8));
              if ((uVar11 & 4) == 0) {
                *puVar7 = 0;
              }
              else {
                *puVar7 = 0;
                puVar7[1] = 0;
              }
            }
            *pwVar10 = 0;
            if (((anon_union_4_5_35ddcec3_for_WirePointer_1 *)((long)local_d0.words + 4))->
                upper32Bits != 0 || ((WireValue<uint32_t> *)&(local_d0.words)->content)->value != 0)
            {
              WireHelpers::zeroObject(local_d0.segment,local_b0,(WirePointer *)local_d0.words);
            }
            AVar24.words = local_d0.words;
            AVar24.segment = local_d0.segment;
            pwVar10 = (local_d0.segment)->pos;
            uVar8 = uVar15 + 1 & 0xffffffff;
            local_78 = uVar16;
            if (((long)((long)((local_d0.segment)->super_SegmentReader).ptr.ptr +
                       (((local_d0.segment)->super_SegmentReader).ptr.size_ * 8 - (long)pwVar10)) >>
                 3 < (long)uVar8) ||
               ((local_d0.segment)->pos = pwVar10 + uVar8, pwVar10 == (word *)0x0)) {
              uVar11 = (int)uVar15 + 2;
              pBVar5 = (BuilderArena *)((local_d0.segment)->super_SegmentReader).arena;
              local_80 = __return_storage_ptr__;
              if (0x1fffffff < uVar11) {
                WireHelpers::allocate::anon_class_1_0_00000001::operator()
                          ((anon_class_1_0_00000001 *)&local_98);
              }
              AVar24 = BuilderArena::allocate(pBVar5,uVar11);
              ((WireValue<uint32_t> *)&(local_d0.words)->content)->value =
                   (int)AVar24.words - *(int *)&((AVar24.segment)->super_SegmentReader).ptr.ptr &
                   0xfffffff8U | 2;
              *(uint *)((long)local_d0.words + 4) = ((AVar24.segment)->super_SegmentReader).id.value
              ;
              *(undefined4 *)&(AVar24.words)->content = 1;
              pwVar10 = AVar24.words + 1;
            }
            else {
              ((WireValue<uint32_t> *)&(local_d0.words)->content)->value =
                   ((uint)((ulong)((long)pwVar10 - (long)local_d0.words) >> 1) & 0xfffffffc) - 3;
              local_80 = __return_storage_ptr__;
            }
            local_d0.words = AVar24.words;
            *(int *)((long)&(local_d0.words)->content + 4) = (int)uVar15 * 8 + 7;
            *(int *)&pwVar10->content = (int)local_78 * 4;
            *(short *)((long)&pwVar10->content + 4) = (short)uVar20;
            *(StructPointerCount *)((long)&pwVar10->content + 6) = (StructPointerCount)uVar14;
            pwVar9 = pwVar10 + 1;
            if ((int)local_78 == 0) {
              pwVar10 = pwVar9;
              uVar16 = local_90 & 0xffffffff;
            }
            else {
              local_48 = (size_t)(uint)((int)local_58 << 3);
              local_38 = local_90 & 0xffffffff;
              pWVar13 = (WirePointer *)(pwVar10 + ((ulong)uVar20 & 0xffff) + 1);
              local_40 = (ulong)(uint)((int)local_88 * 8);
              local_b8 = (WirePointer *)((long)&local_a0[1].offsetAndKind.value + local_48);
              local_90 = (ulong)(uint)((int)local_90 << 3);
              iVar18 = 0;
              pWVar12 = local_a8;
              local_50 = pwVar9;
              do {
                local_d0 = AVar24;
                if ((short)local_58 != 0) {
                  memcpy(pwVar9,pWVar12,local_48);
                }
                pSVar6 = local_68;
                src = local_b8;
                uVar16 = local_70;
                local_c0 = pWVar13;
                local_a8 = pWVar12;
                AVar24 = local_d0;
                if ((short)local_5c != 0) {
                  do {
                    WireHelpers::transferPointer(local_d0.segment,pWVar13,pSVar6,src);
                    pWVar13 = pWVar13 + 1;
                    src = src + 1;
                    uVar16 = uVar16 - 1;
                    AVar24 = local_d0;
                  } while (uVar16 != 0);
                }
                pwVar9 = pwVar9 + local_88;
                pWVar12 = local_a8 + local_38;
                iVar18 = iVar18 + 1;
                pWVar13 = (WirePointer *)((long)&(local_c0->offsetAndKind).value + local_40);
                local_b8 = (WirePointer *)((long)&(local_b8->offsetAndKind).value + local_90);
                pwVar10 = local_50;
                uVar16 = local_38;
              } while (iVar18 != (int)local_78);
            }
            uVar15 = local_78;
            __return_storage_ptr__ = local_80;
            pCVar22 = local_b0;
            uVar16 = uVar16 * local_78;
            local_d0 = AVar24;
            if (0x1ffffffe < uVar16) {
              WireHelpers::getWritableStructListPointer::anon_class_1_0_00000001::operator()
                        ((anon_class_1_0_00000001 *)&local_98);
            }
            iVar18 = (int)uVar16 + 1;
            if (iVar18 != 0) {
              memset(local_a0,0,(ulong)(uint)(iVar18 * 8));
            }
            __return_storage_ptr__->segment = local_d0.segment;
            __return_storage_ptr__->capTable = pCVar22;
            __return_storage_ptr__->ptr = (byte *)pwVar10;
            __return_storage_ptr__->elementCount = (ListElementCount)uVar15;
            __return_storage_ptr__->step = (int)local_88 << 6;
            __return_storage_ptr__->structDataSize = local_60 << 6;
            __return_storage_ptr__->structPointerCount = (StructPointerCount)uVar14;
          }
          else {
            __return_storage_ptr__->segment = local_68;
            __return_storage_ptr__->capTable = local_b0;
            __return_storage_ptr__->ptr = (byte *)local_a8;
            __return_storage_ptr__->elementCount = uVar20;
            __return_storage_ptr__->step = ((uint)uVar2 + (uint)uVar1) * 0x40;
            __return_storage_ptr__->structDataSize = (uint)uVar1 << 6;
            __return_storage_ptr__->structPointerCount = uVar2;
          }
          goto LAB_001c2282;
        }
        getStructList();
        pCVar22 = local_b0;
      }
      else {
        local_a8 = (WirePointer *)(ulong)(uVar20 >> 3);
        if ((uVar20 & 7) == 0) {
          AVar23.words = local_d0.words;
          AVar23.segment = local_d0.segment;
          uVar20 = (uint)(ushort)local_b8;
          uVar11 = (uint)(ushort)local_b8;
          uVar14 = uVar14 + uVar11;
          uVar16 = (ulong)uVar14 * (long)local_a8;
          local_80 = __return_storage_ptr__;
          if (0x1ffffffe < uVar16) {
            WireHelpers::initStructListPointer::anon_class_1_0_00000001::operator()
                      ((anon_class_1_0_00000001 *)&local_98);
          }
          if (((anon_union_4_5_35ddcec3_for_WirePointer_1 *)((long)pwVar10 + 4))->upper32Bits != 0
              || ((WireValue<uint32_t> *)&pwVar10->content)->value != 0) {
            WireHelpers::zeroObject(pSVar6,local_b0,(WirePointer *)pwVar10);
          }
          pwVar9 = pSVar6->pos;
          uVar15 = uVar16 + 1 & 0xffffffff;
          if (((long)((long)(pSVar6->super_SegmentReader).ptr.ptr +
                     ((pSVar6->super_SegmentReader).ptr.size_ * 8 - (long)pwVar9)) >> 3 <
               (long)uVar15) || (pSVar6->pos = pwVar9 + uVar15, pwVar9 == (word *)0x0)) {
            local_c0 = (WirePointer *)CONCAT44(local_c0._4_4_,uVar11);
            uVar20 = (int)uVar16 + 2;
            pBVar5 = (BuilderArena *)(pSVar6->super_SegmentReader).arena;
            if (0x1fffffff < uVar20) {
              WireHelpers::allocate::anon_class_1_0_00000001::operator()
                        ((anon_class_1_0_00000001 *)&local_98);
            }
            AVar23 = BuilderArena::allocate(pBVar5,uVar20);
            ((WireValue<uint32_t> *)&pwVar10->content)->value =
                 (int)AVar23.words - *(int *)&((AVar23.segment)->super_SegmentReader).ptr.ptr &
                 0xfffffff8U | 2;
            *(uint *)((long)pwVar10 + 4) = ((AVar23.segment)->super_SegmentReader).id.value;
            *(undefined4 *)&(AVar23.words)->content = 1;
            pwVar9 = AVar23.words + 1;
          }
          else {
            ((WireValue<uint32_t> *)&pwVar10->content)->value =
                 ((uint)((ulong)((long)pwVar9 - (long)pwVar10) >> 1) & 0xfffffffc) - 3;
            local_c0._0_4_ = uVar20;
          }
          *(int *)((long)&(AVar23.words)->content + 4) = (int)uVar16 * 8 + 7;
          *(ListElementCount *)&pwVar9->content = (ListElementCount)local_a8 * 4;
          *(short *)((long)&pwVar9->content + 4) = (short)local_b8;
          *(ushort *)((long)&pwVar9->content + 6) = uVar19;
          local_80->segment = AVar23.segment;
          local_80->capTable = local_b0;
          local_80->ptr = (byte *)(pwVar9 + 1);
          local_80->elementCount = (ListElementCount)local_a8;
          local_80->step = uVar14 * 0x40;
          local_80->structDataSize = (uint)local_c0 << 6;
          local_80->structPointerCount = uVar19;
          __return_storage_ptr__ = local_80;
          goto LAB_001c2282;
        }
        local_78 = (ulong)bVar21;
        if (bVar21 != 1) {
          if (bVar21 == 6) {
            uVar14 = uVar14 + (uVar14 == 0);
          }
          else {
            uVar11 = (uVar11 & 0xffff) + (uint)(((ulong)local_b8 & 0xffff) == 0);
          }
          uVar3 = *(uint *)(BITS_PER_ELEMENT_TABLE + local_78 * 4);
          local_90 = (ulong)(uVar11 & 0xffff);
          local_88 = (ulong)((uVar14 & 0xffff) + (uVar11 & 0xffff));
          local_c0 = (WirePointer *)(local_88 * (long)local_a8);
          local_80 = __return_storage_ptr__;
          local_70 = (ulong)local_a8;
          if (0x1ffffffe < local_c0) {
            WireHelpers::getWritableStructListPointer::anon_class_1_0_00000001::operator()
                      ((anon_class_1_0_00000001 *)&local_98);
          }
          pwVar10 = local_d0.words;
          if (((((WireValue<uint32_t> *)&(local_d0.words)->content)->value & 3) == 2) &&
             (pSVar6 = BuilderArena::getSegment
                                 ((BuilderArena *)((local_d0.segment)->super_SegmentReader).arena,
                                  (SegmentId)
                                  ((anon_union_4_5_35ddcec3_for_WirePointer_1 *)
                                  ((long)local_d0.words + 4))->structRef), pSVar6->readOnly == false
             )) {
            uVar4 = ((WireValue<uint32_t> *)&pwVar10->content)->value;
            puVar7 = (undefined8 *)
                     ((long)&((pSVar6->super_SegmentReader).ptr.ptr)->content +
                     (ulong)(uVar4 & 0xfffffff8));
            if ((uVar4 & 4) == 0) {
              *puVar7 = 0;
            }
            else {
              *puVar7 = 0;
              puVar7[1] = 0;
            }
          }
          iVar18 = (int)local_c0;
          *pwVar10 = 0;
          uVar16 = (long)local_c0 + 1;
          if (((anon_union_4_5_35ddcec3_for_WirePointer_1 *)((long)local_d0.words + 4))->upper32Bits
              != 0 || ((WireValue<uint32_t> *)&(local_d0.words)->content)->value != 0) {
            WireHelpers::zeroObject(local_d0.segment,local_b0,(WirePointer *)local_d0.words);
            iVar18 = (int)local_c0;
          }
          AVar25.words = local_d0.words;
          AVar25.segment = local_d0.segment;
          iVar17 = (uint)(bVar21 == 6) << 6;
          pwVar10 = (local_d0.segment)->pos;
          uVar16 = uVar16 & 0xffffffff;
          local_b8._0_4_ = iVar17;
          if (((long)((long)((local_d0.segment)->super_SegmentReader).ptr.ptr +
                     (((local_d0.segment)->super_SegmentReader).ptr.size_ * 8 - (long)pwVar10)) >> 3
               < (long)uVar16) ||
             ((local_d0.segment)->pos = pwVar10 + uVar16, pwVar10 == (word *)0x0)) {
            pBVar5 = (BuilderArena *)((local_d0.segment)->super_SegmentReader).arena;
            if (0x1fffffff < iVar18 + 2U) {
              WireHelpers::allocate::anon_class_1_0_00000001::operator()
                        ((anon_class_1_0_00000001 *)&local_98);
            }
            AVar25 = BuilderArena::allocate(pBVar5,iVar18 + 2U);
            ((WireValue<uint32_t> *)&(local_d0.words)->content)->value =
                 (int)AVar25.words - *(int *)&((AVar25.segment)->super_SegmentReader).ptr.ptr &
                 0xfffffff8U | 2;
            *(uint *)((long)local_d0.words + 4) = ((AVar25.segment)->super_SegmentReader).id.value;
            *(undefined4 *)&(AVar25.words)->content = 1;
            pwVar10 = AVar25.words + 1;
            iVar18 = (int)local_c0;
          }
          else {
            ((WireValue<uint32_t> *)&(local_d0.words)->content)->value =
                 ((uint)((ulong)((long)pwVar10 - (long)local_d0.words) >> 1) & 0xfffffffc) - 3;
          }
          pSVar6 = local_68;
          local_d0.words = AVar25.words;
          local_b8 = (WirePointer *)CONCAT44(local_b8._4_4_,(uint)local_b8 + uVar3);
          *(int *)((long)&(local_d0.words)->content + 4) = iVar18 * 8 + 7;
          pwVar9 = pwVar10 + 1;
          *(int *)&pwVar10->content = (int)local_a8 * 4;
          *(short *)((long)&pwVar10->content + 4) = (short)uVar11;
          *(StructPointerCount *)((long)&pwVar10->content + 6) = (StructPointerCount)uVar14;
          iVar18 = (int)local_88;
          local_c0 = (WirePointer *)pwVar9;
          local_d0 = AVar25;
          if (bVar21 == 6) {
            if (7 < uVar20) {
              pWVar12 = (WirePointer *)(pwVar9 + local_90);
              uVar16 = (ulong)local_a8 & 0xffffffff;
              pWVar13 = local_a0;
              do {
                WireHelpers::transferPointer(local_d0.segment,pWVar12,pSVar6,pWVar13);
                pWVar13 = pWVar13 + 1;
                pWVar12 = (WirePointer *)
                          ((long)&(pWVar12->offsetAndKind).value + (ulong)(uint)(iVar18 * 8));
                uVar20 = (int)uVar16 - 1;
                uVar16 = (ulong)uVar20;
              } while (uVar20 != 0);
            }
          }
          else if (7 < uVar20) {
            uVar8 = (ulong)(uVar3 >> 3);
            uVar16 = local_78 - 6;
            uVar15 = (ulong)local_a8 & 0xffffffff;
            pWVar12 = local_a0;
            do {
              if (0xfffffffffffffffb < uVar16) {
                memcpy(pwVar9,pWVar12,uVar8);
              }
              pWVar12 = (WirePointer *)((long)&(pWVar12->offsetAndKind).value + uVar8);
              pwVar9 = (word *)((long)&pwVar9->content + (ulong)(uint)(iVar18 * 8));
              uVar20 = (int)uVar15 - 1;
              uVar15 = (ulong)uVar20;
            } while (uVar20 != 0);
          }
          uVar15 = ((ulong)local_b8 & 0xffffffff) * local_70;
          uVar16 = uVar15 + 0x3f;
          if (0x7ffffff80 < uVar15) {
            WireHelpers::getWritableStructListPointer::anon_class_1_0_00000001::operator()
                      ((anon_class_1_0_00000001 *)&local_98);
          }
          __return_storage_ptr__ = local_80;
          pCVar22 = local_b0;
          if ((int)(uVar16 >> 6) != 0) {
            memset(local_a0,0,(ulong)((uint)(uVar16 >> 3) & 0xfffffff8));
          }
          __return_storage_ptr__->segment = local_d0.segment;
          __return_storage_ptr__->capTable = pCVar22;
          __return_storage_ptr__->ptr = (byte *)local_c0;
          __return_storage_ptr__->elementCount = (ListElementCount)local_a8;
          __return_storage_ptr__->step = (int)local_88 << 6;
          __return_storage_ptr__->structDataSize = (int)local_90 << 6;
          __return_storage_ptr__->structPointerCount = (StructPointerCount)uVar14;
          goto LAB_001c2282;
        }
        local_80 = __return_storage_ptr__;
        kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[106]>
                  (&local_98,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/layout.c++"
                   ,0x603,FAILED,"oldSize != ElementSize::BIT",
                   "\"Found bit list where struct list was expected; upgrading boolean lists to structs \" \"is no longer supported.\""
                   ,(char (*) [106])
                    "Found bit list where struct list was expected; upgrading boolean lists to structs is no longer supported."
                  );
        kj::_::Debug::Fault::~Fault(&local_98);
        pCVar22 = local_b0;
      }
    }
    else {
      getStructList();
      pCVar22 = local_b0;
    }
LAB_001c1912:
    if (((WirePointer *)defaultValue == (WirePointer *)0x0) ||
       ((((WirePointer *)defaultValue)->field_1).upper32Bits == 0 &&
        (((WirePointer *)defaultValue)->offsetAndKind).value == 0)) break;
    local_a0 = (WirePointer *)
               WireHelpers::copyMessage
                         (&local_d0.segment,pCVar22,(WirePointer **)&local_d0.words,
                          (WirePointer *)defaultValue);
    uVar20 = ((WireValue<uint32_t> *)&(local_d0.words)->content)->value;
    defaultValue = (word *)0x0;
  }
  __return_storage_ptr__->ptr = (byte *)0x0;
  __return_storage_ptr__->elementCount = 0;
  __return_storage_ptr__->step = 0;
  __return_storage_ptr__->segment = (SegmentBuilder *)0x0;
  __return_storage_ptr__->capTable = (CapTableBuilder *)0x0;
  *(undefined8 *)((long)&__return_storage_ptr__->step + 2) = 0;
LAB_001c2282:
  __return_storage_ptr__->elementSize = INLINE_COMPOSITE;
  return __return_storage_ptr__;
}

Assistant:

ListBuilder PointerBuilder::getStructList(StructSize elementSize, const word* defaultValue) {
  return WireHelpers::getWritableStructListPointer(
      pointer, segment, capTable, elementSize, defaultValue);
}